

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O2

void __thiscall
Assimp::MDLImporter::CopyMaterials_3DGS_MDL7(MDLImporter *this,IntSharedData_MDL7 *shared)

{
  aiScene *paVar1;
  uint i;
  aiMaterial **ppaVar2;
  ulong uVar3;
  
  this->pScene->mNumMaterials =
       (uint)((ulong)((long)(shared->pcMats).
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(shared->pcMats).
                           super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3);
  paVar1 = this->pScene;
  ppaVar2 = (aiMaterial **)operator_new__((ulong)paVar1->mNumMaterials << 3);
  paVar1->mMaterials = ppaVar2;
  for (uVar3 = 0; uVar3 < this->pScene->mNumMaterials; uVar3 = uVar3 + 1) {
    this->pScene->mMaterials[uVar3] =
         (shared->pcMats).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
         super__Vector_impl_data._M_start[uVar3];
  }
  return;
}

Assistant:

void MDLImporter::CopyMaterials_3DGS_MDL7(MDL::IntSharedData_MDL7 &shared)
{
    pScene->mNumMaterials = (unsigned int)shared.pcMats.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    for (unsigned int i = 0; i < pScene->mNumMaterials;++i)
        pScene->mMaterials[i] = shared.pcMats[i];
}